

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.cpp
# Opt level: O0

int main(void)

{
  Unused *this;
  ostream *this_00;
  Unused *ob1;
  Unused ob2;
  
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  Unused::Unused((Unused *)((long)&ob1 + 7));
  this = (Unused *)operator_new(1);
  Unused::Unused(this);
  nodiscard_eg();
  this_00 = std::operator<<((ostream *)&std::cout,"This fall through is intentional.\n");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
	std::cout << std::endl;
	// [[maybe_unused]]
	Unused ob2; //Stack
	Unused *ob1 = new Unused(); //Heap

	// [[nodiscard]]
	nodiscard_eg();

	//[[fallthrough]]
	switch (1) {
		case 1:
			std::cout << "This fall through is intentional.\n" << std::endl;
			[[fallthrough]];
		case 2:
			break;
	}
}